

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O0

bool __thiscall
cmProjectCommand::InitialPass
          (cmProjectCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  size_type sVar3;
  char *pcVar4;
  const_reference pvVar5;
  undefined8 uVar6;
  reference pbVar7;
  ulong uVar8;
  ostream *poVar9;
  PolicyID id;
  bool local_af1;
  allocator local_a59;
  undefined1 local_a58 [8];
  string m;
  bool readit;
  char *include;
  undefined1 local_a08 [8];
  string extraInclude;
  value_type local_9e0;
  allocator local_9b9;
  value_type local_9b8;
  string local_998;
  string local_978;
  undefined1 local_958 [8];
  ostringstream w;
  char *v_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_7d0;
  iterator i_2;
  string vw;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  allocator local_701;
  value_type local_700;
  allocator local_6d9;
  value_type local_6d8;
  allocator local_6b1;
  value_type local_6b0;
  allocator local_689;
  value_type local_688;
  allocator local_661;
  value_type local_660;
  undefined1 local_640 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vv_1;
  string local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  allocator local_5d9;
  string local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  allocator local_591;
  string local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  allocator local_549;
  string local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  allocator local_501;
  string local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  undefined1 local_4c0 [8];
  string vv;
  int i_1;
  int vc;
  uint v [4];
  char vb [4] [64];
  char *sep;
  string vs;
  undefined1 local_340 [8];
  string e;
  RegularExpression vx;
  string local_248;
  PolicyStatus local_228;
  allocator local_221;
  PolicyStatus cmp0048;
  allocator local_1f9;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  int local_1b0;
  allocator local_1a9;
  string local_1a8;
  ulong local_188;
  size_t i;
  undefined1 local_178 [4];
  Doing doing;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  string version;
  undefined1 local_138 [5];
  bool haveLanguages;
  bool haveVersion;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string srcdir;
  string bindir;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_3_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmProjectCommand *this_local;
  
  local_28 = param_2;
  param_3_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"PROJECT called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_004d9b1c;
  }
  pcVar1 = (this->super_cmCommand).Makefile;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)param_3_local,0);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmMakefile::SetProjectName(pcVar1,pcVar4);
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_3_local,0);
  std::__cxx11::string::string((string *)(srcdir.field_2._M_local_buf + 8),(string *)pvVar5);
  std::__cxx11::string::operator+=((string *)(srcdir.field_2._M_local_buf + 8),"_BINARY_DIR");
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_3_local,0);
  std::__cxx11::string::string((string *)local_a0,(string *)pvVar5);
  std::__cxx11::string::operator+=((string *)local_a0,"_SOURCE_DIR");
  pcVar1 = (this->super_cmCommand).Makefile;
  pcVar4 = cmMakefile::GetCurrentBinaryDirectory(pcVar1);
  cmMakefile::AddCacheDefinition
            (pcVar1,(string *)((long)&srcdir.field_2 + 8),pcVar4,"Value Computed by CMake",STATIC,
             false);
  pcVar1 = (this->super_cmCommand).Makefile;
  pcVar4 = cmMakefile::GetCurrentSourceDirectory(pcVar1);
  cmMakefile::AddCacheDefinition
            (pcVar1,(string *)local_a0,pcVar4,"Value Computed by CMake",STATIC,false);
  std::__cxx11::string::operator=((string *)(srcdir.field_2._M_local_buf + 8),"PROJECT_BINARY_DIR");
  std::__cxx11::string::operator=((string *)local_a0,"PROJECT_SOURCE_DIR");
  pcVar1 = (this->super_cmCommand).Makefile;
  pcVar4 = cmMakefile::GetCurrentBinaryDirectory(pcVar1);
  cmMakefile::AddDefinition(pcVar1,(string *)((long)&srcdir.field_2 + 8),pcVar4);
  pcVar1 = (this->super_cmCommand).Makefile;
  pcVar4 = cmMakefile::GetCurrentSourceDirectory(pcVar1);
  cmMakefile::AddDefinition(pcVar1,(string *)local_a0,pcVar4);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"PROJECT_NAME",&local_c1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)param_3_local,0);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(pcVar1,&local_c0,pcVar4);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"CMAKE_PROJECT_NAME",&local_e9);
  pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_e8);
  local_af1 = true;
  if (pcVar4 != (char *)0x0) {
    local_af1 = cmMakefile::IsRootMakefile((this->super_cmCommand).Makefile);
  }
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  if (local_af1 != false) {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_110,"CMAKE_PROJECT_NAME",&local_111);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_3_local,0);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(pcVar1,&local_110,pcVar4);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_138,"CMAKE_PROJECT_NAME",
               (allocator *)(version.field_2._M_local_buf + 0xf));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_3_local,0);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddCacheDefinition
              (pcVar1,(string *)local_138,pcVar4,"Value Computed by CMake",STATIC,false);
    std::__cxx11::string::~string((string *)local_138);
    std::allocator<char>::~allocator((allocator<char> *)(version.field_2._M_local_buf + 0xf));
  }
  version.field_2._M_local_buf[0xe] = '\0';
  version.field_2._M_local_buf[0xd] = '\0';
  std::__cxx11::string::string
            ((string *)
             &languages.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_178);
  i._4_4_ = 0;
  for (local_188 = 1; uVar8 = local_188,
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_3_local), uVar8 < sVar3; local_188 = local_188 + 1) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_3_local,local_188);
    bVar2 = std::operator==(pvVar5,"LANGUAGES");
    if (bVar2) {
      if ((version.field_2._M_local_buf[0xd] & 1U) != 0) {
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1a8,"LANGUAGES may be specified at most once.",&local_1a9);
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
        cmSystemTools::SetFatalErrorOccured();
        this_local._7_1_ = 1;
        local_1b0 = 1;
        goto LAB_004d9abe;
      }
      version.field_2._M_local_buf[0xd] = '\x01';
      i._4_4_ = 0;
    }
    else {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_3_local,local_188);
      bVar2 = std::operator==(pvVar5,"VERSION");
      if (bVar2) {
        if ((version.field_2._M_local_buf[0xe] & 1U) != 0) {
          pcVar1 = (this->super_cmCommand).Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1d0,"VERSION may be specified at most once.",&local_1d1);
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
          cmSystemTools::SetFatalErrorOccured();
          this_local._7_1_ = 1;
          local_1b0 = 1;
          goto LAB_004d9abe;
        }
        version.field_2._M_local_buf[0xe] = '\x01';
        i._4_4_ = 1;
      }
      else if (i._4_4_ == 1) {
        i._4_4_ = 0;
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_3_local,local_188);
        std::__cxx11::string::operator=
                  ((string *)
                   &languages.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvVar5);
      }
      else {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_3_local,local_188);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_178,pvVar5);
      }
    }
  }
  if ((((version.field_2._M_local_buf[0xe] & 1U) == 0) ||
      ((version.field_2._M_local_buf[0xd] & 1U) != 0)) ||
     (bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_178), bVar2)) {
    if (((version.field_2._M_local_buf[0xd] & 1U) != 0) &&
       (bVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_178), bVar2)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&cmp0048,"NONE",&local_221);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_178,(value_type *)&cmp0048);
      std::__cxx11::string::~string((string *)&cmp0048);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
    }
    local_228 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0048);
    if ((version.field_2._M_local_buf[0xe] & 1U) == 0) {
      if (local_228 != OLD) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_640);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_660,"PROJECT_VERSION",&local_661);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_640,&local_660);
        std::__cxx11::string::~string((string *)&local_660);
        std::allocator<char>::~allocator((allocator<char> *)&local_661);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_688,"PROJECT_VERSION_MAJOR",&local_689);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_640,&local_688);
        std::__cxx11::string::~string((string *)&local_688);
        std::allocator<char>::~allocator((allocator<char> *)&local_689);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_6b0,"PROJECT_VERSION_MINOR",&local_6b1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_640,&local_6b0);
        std::__cxx11::string::~string((string *)&local_6b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_6d8,"PROJECT_VERSION_PATCH",&local_6d9);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_640,&local_6d8);
        std::__cxx11::string::~string((string *)&local_6d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_700,"PROJECT_VERSION_TWEAK",&local_701);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_640,&local_700);
        std::__cxx11::string::~string((string *)&local_700);
        std::allocator<char>::~allocator((allocator<char> *)&local_701);
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_3_local,0);
        std::operator+(&local_728,pvVar5,"_VERSION");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_640,&local_728);
        std::__cxx11::string::~string((string *)&local_728);
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_3_local,0);
        std::operator+(&local_748,pvVar5,"_VERSION_MAJOR");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_640,&local_748);
        std::__cxx11::string::~string((string *)&local_748);
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_3_local,0);
        std::operator+(&local_768,pvVar5,"_VERSION_MINOR");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_640,&local_768);
        std::__cxx11::string::~string((string *)&local_768);
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_3_local,0);
        std::operator+(&local_788,pvVar5,"_VERSION_PATCH");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_640,&local_788);
        std::__cxx11::string::~string((string *)&local_788);
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_3_local,0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&vw.field_2 + 8),pvVar5,"_VERSION_TWEAK");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_640,(value_type *)((long)&vw.field_2 + 8));
        std::__cxx11::string::~string((string *)(vw.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)&i_2);
        local_7d0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_640);
        while( true ) {
          v_1 = (char *)std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_640);
          bVar2 = __gnu_cxx::operator!=
                            (&local_7d0,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&v_1);
          if (!bVar2) break;
          pcVar1 = (this->super_cmCommand).Makefile;
          pbVar7 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_7d0);
          pcVar4 = cmMakefile::GetDefinition(pcVar1,pbVar7);
          if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
            if (local_228 == WARN) {
              std::__cxx11::string::operator+=((string *)&i_2,"\n  ");
              pbVar7 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_7d0);
              std::__cxx11::string::operator+=((string *)&i_2,(string *)pbVar7);
            }
            else {
              pcVar1 = (this->super_cmCommand).Makefile;
              pbVar7 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_7d0);
              cmMakefile::AddDefinition(pcVar1,pbVar7,"");
            }
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_7d0);
        }
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_958);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_978,(cmPolicies *)0x30,id);
          poVar9 = std::operator<<((ostream *)local_958,(string *)&local_978);
          poVar9 = std::operator<<(poVar9,"\nThe following variable(s) would be set to empty:");
          std::operator<<(poVar9,(string *)&i_2);
          std::__cxx11::string::~string((string *)&local_978);
          pcVar1 = (this->super_cmCommand).Makefile;
          std::__cxx11::ostringstream::str();
          cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_998);
          std::__cxx11::string::~string((string *)&local_998);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_958);
        }
        std::__cxx11::string::~string((string *)&i_2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_640);
      }
LAB_004d9775:
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_178);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_9b8,"C",&local_9b9);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_178,&local_9b8);
        std::__cxx11::string::~string((string *)&local_9b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_9b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_9e0,"CXX",(allocator *)(extraInclude.field_2._M_local_buf + 0xf)
                  );
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_178,&local_9e0);
        std::__cxx11::string::~string((string *)&local_9e0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(extraInclude.field_2._M_local_buf + 0xf));
      }
      cmMakefile::EnableLanguage
                ((this->super_cmCommand).Makefile,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_178,false);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_3_local,0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&include,
                     "CMAKE_PROJECT_",pvVar5);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a08,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&include,
                     "_INCLUDE");
      std::__cxx11::string::~string((string *)&include);
      pcVar4 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,(string *)local_a08);
      if (((pcVar4 == (char *)0x0) ||
          (m.field_2._M_local_buf[0xf] =
                cmMakefile::ReadDependentFile((this->super_cmCommand).Makefile,pcVar4,true),
          (bool)m.field_2._M_local_buf[0xf])) ||
         (bVar2 = cmSystemTools::GetFatalErrorOccured(), bVar2)) {
        this_local._7_1_ = 1;
        local_1b0 = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_a58,"could not find file:\n  ",&local_a59);
        std::allocator<char>::~allocator((allocator<char> *)&local_a59);
        std::__cxx11::string::operator+=((string *)local_a58,pcVar4);
        cmCommand::SetError(&this->super_cmCommand,(string *)local_a58);
        this_local._7_1_ = 0;
        local_1b0 = 1;
        std::__cxx11::string::~string((string *)local_a58);
      }
      std::__cxx11::string::~string((string *)local_a08);
    }
    else if ((local_228 == OLD) || (local_228 == WARN)) {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_248,"VERSION not allowed unless CMP0048 is set to NEW",
                 (allocator *)((long)&vx.searchstring + 7));
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator((allocator<char> *)((long)&vx.searchstring + 7));
      cmSystemTools::SetFatalErrorOccured();
      this_local._7_1_ = 1;
      local_1b0 = 1;
    }
    else {
      cmsys::RegularExpression::RegularExpression
                ((RegularExpression *)((long)&e.field_2 + 8),
                 "^([0-9]+(\\.[0-9]+(\\.[0-9]+(\\.[0-9]+)?)?)?)?$");
      bVar2 = cmsys::RegularExpression::find
                        ((RegularExpression *)((long)&e.field_2 + 8),
                         (string *)
                         &languages.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar2) {
        std::__cxx11::string::string((string *)&sep);
        vb[3]._56_8_ = (long)"user=%s\x01auth=Bearer %s\x01\x01" + 0x18;
        memset(&i_1,0,0x10);
        uVar6 = std::__cxx11::string::c_str();
        vv.field_2._12_4_ = __isoc99_sscanf(uVar6,"%u.%u.%u.%u",&i_1,&vc,v,v + 1);
        for (vv.field_2._8_4_ = 0; (int)vv.field_2._8_4_ < 4;
            vv.field_2._8_4_ = vv.field_2._8_4_ + 1) {
          if ((int)vv.field_2._8_4_ < (int)vv.field_2._12_4_) {
            sprintf(vb[(long)(int)vv.field_2._8_4_ + -1] + 0x38,"%u",
                    (ulong)(uint)(&i_1)[(int)vv.field_2._8_4_]);
            std::__cxx11::string::operator+=((string *)&sep,(char *)vb[3]._56_8_);
            std::__cxx11::string::operator+=
                      ((string *)&sep,vb[(long)(int)vv.field_2._8_4_ + -1] + 0x38);
            vb[3]._56_8_ = (long)"@cd ." + 4;
          }
          else {
            vb[(long)(int)vv.field_2._8_4_ + -1][0x38] = '\0';
          }
        }
        std::__cxx11::string::string((string *)local_4c0);
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_3_local,0);
        std::operator+(&local_4e0,pvVar5,"_VERSION");
        std::__cxx11::string::operator=((string *)local_4c0,(string *)&local_4e0);
        std::__cxx11::string::~string((string *)&local_4e0);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_500,"PROJECT_VERSION",&local_501);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(pcVar1,&local_500,pcVar4);
        std::__cxx11::string::~string((string *)&local_500);
        std::allocator<char>::~allocator((allocator<char> *)&local_501);
        pcVar1 = (this->super_cmCommand).Makefile;
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(pcVar1,(string *)local_4c0,pcVar4);
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_3_local,0);
        std::operator+(&local_528,pvVar5,"_VERSION_MAJOR");
        std::__cxx11::string::operator=((string *)local_4c0,(string *)&local_528);
        std::__cxx11::string::~string((string *)&local_528);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_548,"PROJECT_VERSION_MAJOR",&local_549);
        cmMakefile::AddDefinition(pcVar1,&local_548,(char *)(v + 2));
        std::__cxx11::string::~string((string *)&local_548);
        std::allocator<char>::~allocator((allocator<char> *)&local_549);
        cmMakefile::AddDefinition
                  ((this->super_cmCommand).Makefile,(string *)local_4c0,(char *)(v + 2));
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_3_local,0);
        std::operator+(&local_570,pvVar5,"_VERSION_MINOR");
        std::__cxx11::string::operator=((string *)local_4c0,(string *)&local_570);
        std::__cxx11::string::~string((string *)&local_570);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_590,"PROJECT_VERSION_MINOR",&local_591);
        cmMakefile::AddDefinition(pcVar1,&local_590,vb[0] + 0x38);
        std::__cxx11::string::~string((string *)&local_590);
        std::allocator<char>::~allocator((allocator<char> *)&local_591);
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,(string *)local_4c0,vb[0] + 0x38)
        ;
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_3_local,0);
        std::operator+(&local_5b8,pvVar5,"_VERSION_PATCH");
        std::__cxx11::string::operator=((string *)local_4c0,(string *)&local_5b8);
        std::__cxx11::string::~string((string *)&local_5b8);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_5d8,"PROJECT_VERSION_PATCH",&local_5d9);
        cmMakefile::AddDefinition(pcVar1,&local_5d8,vb[1] + 0x38);
        std::__cxx11::string::~string((string *)&local_5d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,(string *)local_4c0,vb[1] + 0x38)
        ;
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_3_local,0);
        std::operator+(&local_600,pvVar5,"_VERSION_TWEAK");
        std::__cxx11::string::operator=((string *)local_4c0,(string *)&local_600);
        std::__cxx11::string::~string((string *)&local_600);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_620,"PROJECT_VERSION_TWEAK",
                   (allocator *)
                   ((long)&vv_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmMakefile::AddDefinition(pcVar1,&local_620,vb[2] + 0x38);
        std::__cxx11::string::~string((string *)&local_620);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&vv_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,(string *)local_4c0,vb[2] + 0x38)
        ;
        std::__cxx11::string::~string((string *)local_4c0);
        std::__cxx11::string::~string((string *)&sep);
        local_1b0 = 0;
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&vs.field_2 + 8),"VERSION \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &languages.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_340,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&vs.field_2 + 8),"\" format invalid.");
        std::__cxx11::string::~string((string *)(vs.field_2._M_local_buf + 8));
        cmMakefile::IssueMessage((this->super_cmCommand).Makefile,FATAL_ERROR,(string *)local_340);
        cmSystemTools::SetFatalErrorOccured();
        this_local._7_1_ = 1;
        local_1b0 = 1;
        std::__cxx11::string::~string((string *)local_340);
      }
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)((long)&e.field_2 + 8));
      if (local_1b0 == 0) goto LAB_004d9775;
    }
  }
  else {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1f8,"project with VERSION must use LANGUAGES before language names."
               ,&local_1f9);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    cmSystemTools::SetFatalErrorOccured();
    this_local._7_1_ = 1;
    local_1b0 = 1;
  }
LAB_004d9abe:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_178);
  std::__cxx11::string::~string
            ((string *)
             &languages.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)(srcdir.field_2._M_local_buf + 8));
LAB_004d9b1c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmProjectCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("PROJECT called with incorrect number of arguments");
    return false;
    }
  this->Makefile->SetProjectName(args[0].c_str());

  std::string bindir = args[0];
  bindir += "_BINARY_DIR";
  std::string srcdir = args[0];
  srcdir += "_SOURCE_DIR";

  this->Makefile->AddCacheDefinition
    (bindir,
     this->Makefile->GetCurrentBinaryDirectory(),
     "Value Computed by CMake", cmState::STATIC);
  this->Makefile->AddCacheDefinition
    (srcdir,
     this->Makefile->GetCurrentSourceDirectory(),
     "Value Computed by CMake", cmState::STATIC);

  bindir = "PROJECT_BINARY_DIR";
  srcdir = "PROJECT_SOURCE_DIR";

  this->Makefile->AddDefinition(bindir,
          this->Makefile->GetCurrentBinaryDirectory());
  this->Makefile->AddDefinition(srcdir,
          this->Makefile->GetCurrentSourceDirectory());

  this->Makefile->AddDefinition("PROJECT_NAME", args[0].c_str());

  // Set the CMAKE_PROJECT_NAME variable to be the highest-level
  // project name in the tree. If there are two project commands
  // in the same CMakeLists.txt file, and it is the top level
  // CMakeLists.txt file, then go with the last one, so that
  // CMAKE_PROJECT_NAME will match PROJECT_NAME, and cmake --build
  // will work.
  if(!this->Makefile->GetDefinition("CMAKE_PROJECT_NAME")
     || (this->Makefile->IsRootMakefile()))
    {
    this->Makefile->AddDefinition("CMAKE_PROJECT_NAME", args[0].c_str());
    this->Makefile->AddCacheDefinition
      ("CMAKE_PROJECT_NAME",
       args[0].c_str(),
       "Value Computed by CMake", cmState::STATIC);
    }

  bool haveVersion = false;
  bool haveLanguages = false;
  std::string version;
  std::vector<std::string> languages;
  enum Doing { DoingLanguages, DoingVersion };
  Doing doing = DoingLanguages;
  for(size_t i = 1; i < args.size(); ++i)
    {
    if(args[i] == "LANGUAGES")
      {
      if(haveLanguages)
        {
        this->Makefile->IssueMessage
          (cmake::FATAL_ERROR, "LANGUAGES may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
        }
      haveLanguages = true;
      doing = DoingLanguages;
      }
    else if (args[i] == "VERSION")
      {
      if(haveVersion)
        {
        this->Makefile->IssueMessage
          (cmake::FATAL_ERROR, "VERSION may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
        }
      haveVersion = true;
      doing = DoingVersion;
      }
    else if(doing == DoingVersion)
      {
      doing = DoingLanguages;
      version = args[i];
      }
    else // doing == DoingLanguages
      {
      languages.push_back(args[i]);
      }
    }

  if (haveVersion && !haveLanguages && !languages.empty())
    {
    this->Makefile->IssueMessage
      (cmake::FATAL_ERROR,
       "project with VERSION must use LANGUAGES before language names.");
    cmSystemTools::SetFatalErrorOccured();
    return true;
    }
  if (haveLanguages && languages.empty())
    {
    languages.push_back("NONE");
    }

  cmPolicies::PolicyStatus cmp0048 =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0048);
  if (haveVersion)
    {
    // Set project VERSION variables to given values
    if (cmp0048 == cmPolicies::OLD ||
        cmp0048 == cmPolicies::WARN)
      {
      this->Makefile->IssueMessage
        (cmake::FATAL_ERROR,
         "VERSION not allowed unless CMP0048 is set to NEW");
      cmSystemTools::SetFatalErrorOccured();
      return true;
      }

    cmsys::RegularExpression
      vx("^([0-9]+(\\.[0-9]+(\\.[0-9]+(\\.[0-9]+)?)?)?)?$");
    if(!vx.find(version))
      {
      std::string e = "VERSION \"" + version + "\" format invalid.";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e);
      cmSystemTools::SetFatalErrorOccured();
      return true;
      }

    std::string vs;
    const char* sep = "";
    char vb[4][64];
    unsigned int v[4] = {0,0,0,0};
    int vc = sscanf(version.c_str(), "%u.%u.%u.%u",
                    &v[0], &v[1], &v[2], &v[3]);
    for(int i=0; i < 4; ++i)
      {
      if(i < vc)
        {
        sprintf(vb[i], "%u", v[i]);
        vs += sep;
        vs += vb[i];
        sep = ".";
        }
      else
        {
        vb[i][0] = 0;
        }
      }

    std::string vv;
    vv = args[0] + "_VERSION";
    this->Makefile->AddDefinition("PROJECT_VERSION", vs.c_str());
    this->Makefile->AddDefinition(vv, vs.c_str());
    vv = args[0] + "_VERSION_MAJOR";
    this->Makefile->AddDefinition("PROJECT_VERSION_MAJOR", vb[0]);
    this->Makefile->AddDefinition(vv, vb[0]);
    vv = args[0] + "_VERSION_MINOR";
    this->Makefile->AddDefinition("PROJECT_VERSION_MINOR", vb[1]);
    this->Makefile->AddDefinition(vv, vb[1]);
    vv = args[0] + "_VERSION_PATCH";
    this->Makefile->AddDefinition("PROJECT_VERSION_PATCH", vb[2]);
    this->Makefile->AddDefinition(vv, vb[2]);
    vv = args[0] + "_VERSION_TWEAK";
    this->Makefile->AddDefinition("PROJECT_VERSION_TWEAK", vb[3]);
    this->Makefile->AddDefinition(vv, vb[3]);
    }
  else if(cmp0048 != cmPolicies::OLD)
    {
    // Set project VERSION variables to empty
    std::vector<std::string> vv;
    vv.push_back("PROJECT_VERSION");
    vv.push_back("PROJECT_VERSION_MAJOR");
    vv.push_back("PROJECT_VERSION_MINOR");
    vv.push_back("PROJECT_VERSION_PATCH");
    vv.push_back("PROJECT_VERSION_TWEAK");
    vv.push_back(args[0] + "_VERSION");
    vv.push_back(args[0] + "_VERSION_MAJOR");
    vv.push_back(args[0] + "_VERSION_MINOR");
    vv.push_back(args[0] + "_VERSION_PATCH");
    vv.push_back(args[0] + "_VERSION_TWEAK");
    std::string vw;
    for(std::vector<std::string>::iterator i = vv.begin();
        i != vv.end(); ++i)
      {
      const char* v = this->Makefile->GetDefinition(*i);
      if(v && *v)
        {
        if(cmp0048 == cmPolicies::WARN)
          {
          vw += "\n  ";
          vw += *i;
          }
        else
          {
          this->Makefile->AddDefinition(*i, "");
          }
        }
      }
    if(!vw.empty())
      {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0048)
        << "\nThe following variable(s) would be set to empty:" << vw;
      this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
      }
    }

  if (languages.empty())
    {
    // if no language is specified do c and c++
    languages.push_back("C");
    languages.push_back("CXX");
    }
  this->Makefile->EnableLanguage(languages, false);
  std::string extraInclude = "CMAKE_PROJECT_" + args[0] + "_INCLUDE";
  const char* include = this->Makefile->GetDefinition(extraInclude);
  if(include)
    {
    bool readit =
      this->Makefile->ReadDependentFile(include);
    if(!readit && !cmSystemTools::GetFatalErrorOccured())
      {
      std::string m =
        "could not find file:\n"
        "  ";
      m += include;
      this->SetError(m);
      return false;
      }
    }
  return true;
}